

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation_p.h
# Opt level: O0

void __thiscall QScrollbarStyleAnimation::~QScrollbarStyleAnimation(QScrollbarStyleAnimation *this)

{
  void *in_RDI;
  
  ~QScrollbarStyleAnimation((QScrollbarStyleAnimation *)0x4c7a3c);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QScrollbarStyleAnimation : public QNumberStyleAnimation
{
    Q_OBJECT

public:
    enum Mode { Activating, Deactivating };

    QScrollbarStyleAnimation(Mode mode, QObject *target);

    Mode mode() const;

    bool wasActive() const;
    void setActive(bool active);

private slots:
    void updateCurrentTime(int time) override;

private:
    Mode _mode;
    bool _active;
}